

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
          (SmallVector<char,256u> *this,char *S,char *E)

{
  *(SmallVector<char,256u> **)this = this + 0x10;
  *(undefined8 *)(this + 8) = 0x10000000000;
  SmallVectorImpl<char>::append<char_const*,void>((SmallVectorImpl<char> *)this,S,E);
  return;
}

Assistant:

SmallVector(ItTy S, ItTy E) : SmallVectorImpl<T>(N) {
    this->append(S, E);
  }